

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

void __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
iterator::iterator(iterator *this,
                  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *src,
                  bool v)

{
  bool bVar1;
  bool v_local;
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *src_local;
  iterator *this_local;
  
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::GroupByState
            (&this->source,src);
  this->valid = false;
  this->valid = v;
  if (v) {
    GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::Init(&this->source);
    bVar1 = GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::Valid
                      (&this->source);
    this->valid = bVar1;
  }
  return;
}

Assistant:

iterator(S src, bool v = true) : source(src) {
				valid = v;
				
				if(v) { 
					source.Init();	
					valid = source.Valid();
				}
			}